

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort_TEST.cpp
# Opt level: O2

void __thiscall
Valid_case_test_Sort_Sort_unit_test_Test::TestBody(Valid_case_test_Sort_Sort_unit_test_Test *this)

{
  int i;
  int *a;
  long lVar1;
  char *pcVar2;
  int j;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertionResult gtest_ar;
  
  a = (int *)operator_new__(20000);
  for (lVar1 = 0; lVar1 != 5000; lVar1 = lVar1 + 1) {
    a[lVar1] = (int)lVar1;
  }
  SelectionSort<int>(a,5000,Less<int>);
  for (j = 0; j < 5000; j = j + 1) {
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"j","a[j]",&j,a + j);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x19,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      goto LAB_0010b1a8;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  InsertionSort<int>(a,5000,1,Less<int>);
  for (j = 0; j < 5000; j = j + 1) {
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"j","a[j]",&j,a + j);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x22,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      goto LAB_0010b1a8;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  HeapSort<int>(a,5000,Less<int>);
  for (j = 0; j < 5000; j = j + 1) {
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"j","a[j]",&j,a + j);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x27,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      goto LAB_0010b1a8;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  QuickSort<int>(a,0,4999,Less<int>);
  for (j = 0; j < 5000; j = j + 1) {
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"j","a[j]",&j,a + j);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x2c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      goto LAB_0010b4a3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  MergeSort<int>(a,5000,Less<int>);
  for (j = 0; j < 5000; j = j + 1) {
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"j","a[j]",&j,a + j);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x31,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
LAB_0010b1a8:
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_48);
      goto LAB_0010b1bf;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  SelectionSort<int>(a,5000,Greater<int>);
  j = 4999;
  for (lVar1 = 0; lVar1 != 20000; lVar1 = lVar1 + 4) {
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"j","a[i]",&j,(int *)((long)a + lVar1));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x3c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      goto LAB_0010b4a3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    j = j + -1;
  }
  InsertionSort<int>(a,5000,1,Greater<int>);
  j = 4999;
  for (lVar1 = 0; lVar1 != 20000; lVar1 = lVar1 + 4) {
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"j","a[i]",&j,(int *)((long)a + lVar1));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x45,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      goto LAB_0010b4a3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    j = j + -1;
  }
  HeapSort<int>(a,5000,Greater<int>);
  j = 4999;
  for (lVar1 = 0; lVar1 != 20000; lVar1 = lVar1 + 4) {
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"j","a[i]",&j,(int *)((long)a + lVar1));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x4a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      goto LAB_0010b4a3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    j = j + -1;
  }
  lVar1 = 0;
  QuickSort<int>(a,0,4999,Greater<int>);
  j = 4999;
  do {
    if (lVar1 == 20000) {
      MergeSort<int>(a,5000,Greater<int>);
      j = 4999;
      lVar1 = 0;
      while( true ) {
        if (lVar1 == 20000) {
          operator_delete__(a);
          return;
        }
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"j","a[i]",&j,(int *)((long)a + lVar1));
        if (gtest_ar.success_ == false) break;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        j = j + -1;
        lVar1 = lVar1 + 4;
      }
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x54,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
LAB_0010b4a3:
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_48);
LAB_0010b1bf:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      return;
    }
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"j","a[i]",&j,(int *)((long)a + lVar1));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x4f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      goto LAB_0010b4a3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    j = j + -1;
    lVar1 = lVar1 + 4;
  } while( true );
}

Assistant:

TEST(Valid_case_test_Sort, Sort_unit_test){

    int n = 5000;
    int *a = new int[n];
    for (int i = 0; i < n; ++i) {
        a[i] = i;
    }

    /*
     * ALL SORT FOLLOW LESS
     */

    SelectionSort(a, n, Less);

    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    /*
     * 1 is h
     * h for shellSort, h can 1, 3, 5
     */
    InsertionSort(a, n, 1, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    HeapSort(a, n, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    QuickSort(a, 0, n - 1, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    MergeSort(a, n, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    //---------------------------

    /*
     * ALL SORT FOLLOW GREATER
     */

    SelectionSort(a, n, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    /*
     * 1 is h
     * h for shellSort, h can 1, 3, 5
     */
    InsertionSort(a, n, 1, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    HeapSort(a, n, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    QuickSort(a, 0,  n - 1, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    MergeSort(a, n, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    delete []a;
}